

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O1

int arkInitialSetup(ARKodeMem ark_mem,realtype tout)

{
  int iVar1;
  ARKodeHAdaptMem pAVar2;
  long lVar3;
  realtype *prVar4;
  char *msgfmt;
  realtype rVar5;
  double dVar6;
  
  if (ark_mem->step_init == (ARKTimestepInitFn)0x0) {
    msgfmt = "Time stepper module is missing";
    goto LAB_004fa664;
  }
  iVar1 = (*ark_mem->step_init)(ark_mem,ark_mem->init_type);
  if (iVar1 != 0) {
    msgfmt = "Error in initialization of time stepper module";
    goto LAB_004fa671;
  }
  if (((ark_mem->fixedstep == 0) || (ark_mem->hin != 0.0)) || (NAN(ark_mem->hin))) {
    if (((ark_mem->user_efun == 0) && (ark_mem->atolmin0 != 0)) &&
       (ark_mem->yn->ops->nvmin == (_func_realtype_N_Vector *)0x0)) {
      msgfmt = "N_VMin unimplemented (required by error-weight function)";
    }
    else if (((ark_mem->user_rfun == 0) && (ark_mem->rwt_is_ewt == 0)) &&
            ((ark_mem->Ratolmin0 != 0 && (ark_mem->yn->ops->nvmin == (_func_realtype_N_Vector *)0x0)
             ))) {
      msgfmt = "N_VMin unimplemented (required by residual-weight function)";
    }
    else {
      if (ark_mem->tstopset != 0) {
        dVar6 = ark_mem->h;
        if ((dVar6 == 0.0) && (!NAN(dVar6))) {
          dVar6 = tout - ark_mem->tcur;
        }
        if ((ark_mem->tstop - ark_mem->tcur) * dVar6 <= 0.0) {
          arkProcessError(ark_mem,-0x16,"ARKode","arkInitialSetup",
                          "The value tstop = %lg is behind current t = %lg in the direction of integration."
                         );
          return -0x16;
        }
      }
      if ((ark_mem->constraintsSet == 0) ||
         (iVar1 = N_VConstrMask(ark_mem->constraints,ark_mem->yn,ark_mem->tempv1), iVar1 != 0)) {
        iVar1 = (*ark_mem->efun)(ark_mem->yn,ark_mem->ewt,ark_mem->e_data);
        if (iVar1 == 0) {
          if (ark_mem->rwt_is_ewt == 0) {
            iVar1 = (*ark_mem->rfun)(ark_mem->yn,ark_mem->rwt,ark_mem->r_data);
            if (iVar1 != 0) {
              if (ark_mem->itol == 2) {
                msgfmt = "The user-provide RwtSet function failed.";
              }
              else {
                msgfmt = "Initial rwt has component(s) equal to zero (illegal).";
              }
              goto LAB_004fa664;
            }
          }
          else {
            ark_mem->rwt = ark_mem->ewt;
          }
          if ((ark_mem->h == 0.0) && (!NAN(ark_mem->h))) {
            ark_mem->h = 1.0;
          }
          iVar1 = (*ark_mem->step_fullrhs)(ark_mem,ark_mem->tcur,ark_mem->yn,ark_mem->fn,0);
          if (iVar1 != 0) {
            return -8;
          }
          if ((ark_mem->interp != (ARKInterp)0x0) &&
             (iVar1 = arkInterpInit(ark_mem,ark_mem->interp,ark_mem->tcur), iVar1 != 0)) {
            return iVar1;
          }
          ark_mem->initialized = 1;
          if ((ark_mem->h0u != 0.0) || (NAN(ark_mem->h0u))) {
            if (((ark_mem->hprime + ark_mem->tcur) - ark_mem->tstop) * ark_mem->h <= 0.0)
            goto LAB_004fabf5;
            dVar6 = (ark_mem->uround * -4.0 + 1.0) * (ark_mem->tstop - ark_mem->tcur);
            ark_mem->hprime = dVar6;
            rVar5 = dVar6 / ark_mem->h;
            lVar3 = 400;
          }
          else {
            dVar6 = ark_mem->hin;
            ark_mem->h = dVar6;
            if (((dVar6 != 0.0) || (NAN(dVar6))) && ((tout - ark_mem->tcur) * dVar6 < 0.0)) {
              msgfmt = "h0 and tout - t0 inconsistent.";
              goto LAB_004fa664;
            }
            if ((dVar6 != 0.0) || (NAN(dVar6))) {
              pAVar2 = ark_mem->hadapt_mem;
              if (ark_mem->nst == 0) goto LAB_004faafa;
              prVar4 = &pAVar2->growth;
            }
            else {
              dVar6 = tout - ark_mem->tcur;
              ark_mem->h = (realtype)
                           (-(ulong)(dVar6 == 0.0) & 0x3ff0000000000000 |
                           ~-(ulong)(dVar6 == 0.0) & (ulong)ABS(dVar6));
              if ((ark_mem->tstopset != 0) && (0.0 < dVar6 * (tout - ark_mem->tstop))) {
                tout = ark_mem->tstop;
              }
              iVar1 = arkHin(ark_mem,tout);
              if (iVar1 != 0) {
                iVar1 = arkHandleFailure(ark_mem,iVar1);
                return iVar1;
              }
              pAVar2 = ark_mem->hadapt_mem;
LAB_004faafa:
              prVar4 = &pAVar2->etamx1;
            }
            pAVar2->etamax = *prVar4;
            dVar6 = ABS(ark_mem->h) * ark_mem->hmax_inv;
            if (1.0 < dVar6) {
              ark_mem->h = ark_mem->h / dVar6;
            }
            dVar6 = ABS(ark_mem->h);
            if (dVar6 < ark_mem->hmin) {
              ark_mem->h = ark_mem->h * (ark_mem->hmin / dVar6);
            }
            if (ark_mem->tstopset != 0) {
              if (0.0 < ((ark_mem->tcur + ark_mem->h) - ark_mem->tstop) * ark_mem->h) {
                ark_mem->h = (ark_mem->uround * -4.0 + 1.0) * (ark_mem->tstop - ark_mem->tcur);
              }
            }
            rVar5 = ark_mem->h;
            ark_mem->h0u = rVar5;
            ark_mem->eta = 1.0;
            lVar3 = 0x180;
          }
          *(realtype *)((long)&ark_mem->sunctx + lVar3) = rVar5;
LAB_004fabf5:
          if (ark_mem->root_mem == (ARKodeRootMem)0x0) {
            return 0;
          }
          if (ark_mem->root_mem->nrtfn < 1) {
            return 0;
          }
          iVar1 = arkRootCheck1(ark_mem);
          if (iVar1 != -0xc) {
            return 0;
          }
          arkProcessError(ark_mem,-0xc,"ARKode","arkRootCheck1",
                          "At t = %lg, the rootfinding routine failed in an unrecoverable manner.",
                          ark_mem->tcur);
          return -0xc;
        }
        if (ark_mem->itol == 2) {
          msgfmt = "The user-provide EwtSet function failed.";
        }
        else {
          msgfmt = "Initial ewt has component(s) equal to zero (illegal).";
        }
      }
      else {
        msgfmt = "y0 fails to satisfy constraints.";
      }
    }
  }
  else {
    msgfmt = "Fixed step mode enabled, but no step size set";
  }
LAB_004fa664:
  iVar1 = -0x16;
LAB_004fa671:
  arkProcessError(ark_mem,iVar1,"ARKode","arkInitialSetup",msgfmt);
  return iVar1;
}

Assistant:

int arkInitialSetup(ARKodeMem ark_mem, realtype tout)
{
  int retval, hflag, istate;
  realtype tout_hin, rh, htmp;
  booleantype conOK;

  /* Set up the time stepper module */
  if (ark_mem->step_init == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkInitialSetup", "Time stepper module is missing");
    return(ARK_ILL_INPUT);
  }
  retval = ark_mem->step_init(ark_mem, ark_mem->init_type);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode", "arkInitialSetup",
                    "Error in initialization of time stepper module");
    return(retval);
  }

  /* Check that user has supplied an initial step size if fixedstep mode is on */
  if ( (ark_mem->fixedstep) && (ark_mem->hin == ZERO) ) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkInitialSetup",
                    "Fixed step mode enabled, but no step size set");
    return(ARK_ILL_INPUT);
  }

  /* If using a built-in routine for error/residual weights with abstol==0,
     ensure that N_VMin is available */
  if ((!ark_mem->user_efun) && (ark_mem->atolmin0) && (!ark_mem->yn->ops->nvmin)) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkInitialSetup",
                    "N_VMin unimplemented (required by error-weight function)");
    return(ARK_ILL_INPUT);
  }
  if ( (!ark_mem->user_rfun) && (!ark_mem->rwt_is_ewt) &&
       (ark_mem->Ratolmin0) && (!ark_mem->yn->ops->nvmin) ) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkInitialSetup",
                    "N_VMin unimplemented (required by residual-weight function)");
    return(ARK_ILL_INPUT);
  }

  /* Test input tstop for legality (correct direction of integration) */
  if ( ark_mem->tstopset ) {
    htmp = (ark_mem->h == ZERO) ? tout - ark_mem->tcur : ark_mem->h;
    if ( (ark_mem->tstop - ark_mem->tcur) * htmp <= ZERO ) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkInitialSetup",
                      MSG_ARK_BAD_TSTOP, ark_mem->tstop, ark_mem->tcur);
      return(ARK_ILL_INPUT);
    }
  }

  /* Check to see if y0 satisfies constraints */
  if (ark_mem->constraintsSet) {
    conOK = N_VConstrMask(ark_mem->constraints, ark_mem->yn, ark_mem->tempv1);
    if (!conOK) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkInitialSetup", MSG_ARK_Y0_FAIL_CONSTR);
      return(ARK_ILL_INPUT);
    }
  }

  /* Load initial error weights */
  retval = ark_mem->efun(ark_mem->yn, ark_mem->ewt, ark_mem->e_data);
  if (retval != 0) {
    if (ark_mem->itol == ARK_WF)
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                      "arkInitialSetup", MSG_ARK_EWT_FAIL);
    else
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                      "arkInitialSetup", MSG_ARK_BAD_EWT);
    return(ARK_ILL_INPUT);
  }

  /* Load initial residual weights */
  if (ark_mem->rwt_is_ewt) {      /* update pointer to ewt */
    ark_mem->rwt = ark_mem->ewt;
  } else {
    retval = ark_mem->rfun(ark_mem->yn, ark_mem->rwt, ark_mem->r_data);
    if (retval != 0) {
      if (ark_mem->itol == ARK_WF)
        arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                        "arkInitialSetup", MSG_ARK_RWT_FAIL);
      else
        arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                        "arkInitialSetup", MSG_ARK_BAD_RWT);
      return(ARK_ILL_INPUT);
    }
  }

  /* If necessary, temporarily set h as it is used to compute the tolerance in a
     potential mass matrix solve when computing the full rhs */
  if (ark_mem->h == ZERO) ark_mem->h = ONE;

  /* Call fullrhs (used in estimating initial step, explicit steppers, Hermite
     interpolation module, and possibly (but not always) arkRootCheck1) */
  retval = ark_mem->step_fullrhs(ark_mem, ark_mem->tcur, ark_mem->yn,
                                 ark_mem->fn, ARK_FULLRHS_START);
  if (retval != 0) return(ARK_RHSFUNC_FAIL);

  /* Fill initial interpolation data (if needed) */
  if (ark_mem->interp != NULL) {
    retval = arkInterpInit(ark_mem, ark_mem->interp, ark_mem->tcur);
    if (retval != 0)  return(retval);
  }

  /* initialization complete */
  ark_mem->initialized = SUNTRUE;

  /* Set initial step size */
  if (ark_mem->h0u == ZERO) {

    /* Check input h for validity */
    ark_mem->h = ark_mem->hin;
    if ( (ark_mem->h != ZERO) &&
         ((tout-ark_mem->tcur)*ark_mem->h < ZERO) ) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkInitialSetup",
                      MSG_ARK_BAD_H0);
      return(ARK_ILL_INPUT);
    }

    /* Estimate initial h if not set */
    if (ark_mem->h == ZERO) {
      /* Again, temporarily set h for estimating an optimal value */
      ark_mem->h = SUNRabs(tout - ark_mem->tcur);
      if (ark_mem->h == ZERO)  ark_mem->h = ONE;
      /* Estimate the first step size */
      tout_hin = tout;
      if ( ark_mem->tstopset &&
           (tout-ark_mem->tcur)*(tout-ark_mem->tstop) > ZERO )
        tout_hin = ark_mem->tstop;
      hflag = arkHin(ark_mem, tout_hin);
      if (hflag != ARK_SUCCESS) {
        istate = arkHandleFailure(ark_mem, hflag);
        return(istate);
      }
      /* Use first step growth factor for estimated h */
      ark_mem->hadapt_mem->etamax = ark_mem->hadapt_mem->etamx1;
    } else if (ark_mem->nst == 0) {
      /* Use first step growth factor for user defined h */
      ark_mem->hadapt_mem->etamax = ark_mem->hadapt_mem->etamx1;
    } else {
      /* Use standard growth factor (e.g., for reset) */
      ark_mem->hadapt_mem->etamax = ark_mem->hadapt_mem->growth;
    }

    /* Enforce step size bounds */
    rh = SUNRabs(ark_mem->h)*ark_mem->hmax_inv;
    if (rh > ONE) ark_mem->h /= rh;
    if (SUNRabs(ark_mem->h) < ark_mem->hmin)
      ark_mem->h *= ark_mem->hmin/SUNRabs(ark_mem->h);

    /* Check for approach to tstop */
    if (ark_mem->tstopset) {
      if ( (ark_mem->tcur + ark_mem->h - ark_mem->tstop)*ark_mem->h > ZERO ) {
        ark_mem->h = (ark_mem->tstop - ark_mem->tcur)*(ONE-FOUR*ark_mem->uround);
      }
    }

    /* Set initial time step factors */
    ark_mem->h0u    = ark_mem->h;
    ark_mem->eta    = ONE;
    ark_mem->hprime = ark_mem->h;
  } else {
    /* If next step would overtake tstop, adjust stepsize */
    if ( (ark_mem->tcur + ark_mem->hprime - ark_mem->tstop)*ark_mem->h > ZERO ) {
      ark_mem->hprime = (ark_mem->tstop - ark_mem->tcur)*(ONE-FOUR*ark_mem->uround);
      ark_mem->eta = ark_mem->hprime/ark_mem->h;
    }
  }

  /* Check for zeros of root function g at and near t0. */
  if (ark_mem->root_mem != NULL) {
    if (ark_mem->root_mem->nrtfn > 0) {
      retval = arkRootCheck1((void*) ark_mem);

      if (retval == ARK_RTFUNC_FAIL) {
        arkProcessError(ark_mem, ARK_RTFUNC_FAIL, "ARKode", "arkRootCheck1",
                        MSG_ARK_RTFUNC_FAILED, ark_mem->tcur);
        return(ARK_RTFUNC_FAIL);
      }
    }
  }

  return(ARK_SUCCESS);
}